

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Abc_ExactDelayCost(word *pTruth,int nVars,int *pArrTimeProfile,char *pPerm,int *Cost,
                      int AigLevel)

{
  char cVar1;
  FILE *pFVar2;
  bool bVar3;
  Ses_Store_t *pSVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Ses_Man_t *pSes;
  char *pcVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong *puVar19;
  long local_c8;
  char *local_b8;
  Ses_Store_t *local_b0;
  ulong local_a8;
  ulong *local_a0;
  timespec ts_3;
  int pNormalArrTime [8];
  int nMaxArrival;
  
  uVar13 = (ulong)(uint)nVars;
  local_b8 = (char *)0x0;
  iVar5 = clock_gettime(3,(timespec *)pNormalArrTime);
  pSVar4 = s_pSesStore;
  if (iVar5 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNormalArrTime._8_8_),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) +
             CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * -1000000;
  }
  if (8 < (uint)nVars) {
    printf("invalid truth table size %d\n",(ulong)(uint)nVars);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xaa9,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
  }
  s_pSesStore->nCutCount = s_pSesStore->nCutCount + 1;
  pSVar4->pCutCount[uVar13] = pSVar4->pCutCount[uVar13] + 1;
  if (nVars == 0) {
    pSVar4->nSynthesizedTrivial = pSVar4->nSynthesizedTrivial + 1;
    pSVar4->pSynthesizedTrivial[0] = pSVar4->pSynthesizedTrivial[0] + 1;
    *Cost = 0;
    iVar5 = clock_gettime(3,(timespec *)pNormalArrTime);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = (long)pNormalArrTime._8_8_ / 1000 +
               CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
    iVar5 = 0;
  }
  else {
    uVar6 = nVars - 1;
    if (uVar6 == 0) {
      pSVar4->nSynthesizedTrivial = pSVar4->nSynthesizedTrivial + 1;
      pSVar4->pSynthesizedTrivial[1] = pSVar4->pSynthesizedTrivial[1] + 1;
      *Cost = 0;
      *pPerm = '\0';
      iVar5 = clock_gettime(3,(timespec *)pNormalArrTime);
      if (iVar5 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = (long)pNormalArrTime._8_8_ / 1000 +
                 CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
      return *pArrTimeProfile;
    }
    memcpy(pNormalArrTime,pArrTimeProfile,(ulong)(uint)(nVars * 4));
    iVar5 = Abc_NormalizeArrivalTimes(pNormalArrTime,nVars,&nMaxArrival);
    local_b0 = (Ses_Store_t *)CONCAT44(local_b0._4_4_,iVar5);
    *Cost = 1000000000;
    iVar5 = Ses_StoreGetEntry(pSVar4,pTruth,nVars,pNormalArrTime,&local_b8);
    pSVar4 = s_pSesStore;
    if (iVar5 == 0) {
      local_a8 = uVar13;
      local_a0 = pTruth;
      if (s_pSesStore->fVeryVerbose != 0) {
        printf("\x1b[36m");
        pFVar2 = _stdout;
        if (nVars < 2) goto LAB_002bf428;
        iVar5 = 1 << ((char)nVars - 6U & 0x1f);
        if (nVars < 7) {
          iVar5 = 1;
        }
        puVar19 = local_a0 + (long)iVar5 + -1;
        if (local_a0 <= puVar19) {
          uVar15 = 0xf;
          if ((int)local_a8 < 6) {
            uVar15 = (ulong)(uint)~(-1 << ((char)nVars - 2U & 0x1f));
          }
          lVar11 = uVar15 << 2;
          lVar16 = uVar15 + 1;
          do {
            uVar7 = (uint)(*puVar19 >> ((byte)lVar11 & 0x3c)) & 0xf;
            iVar5 = uVar7 + 0x30;
            if (9 < uVar7) {
              iVar5 = uVar7 + 0x37;
            }
            fputc(iVar5,pFVar2);
            lVar17 = lVar16 + -1;
            bVar3 = 0 < lVar16;
            lVar11 = lVar11 + -4;
            lVar16 = lVar17;
          } while ((lVar17 != 0 && bVar3) ||
                  (puVar19 = puVar19 + -1, lVar11 = uVar15 << 2, lVar16 = uVar15 + 1,
                  local_a0 <= puVar19));
        }
        printf("\x1b[0m");
        printf(" [%d",(ulong)(uint)pNormalArrTime[0]);
        nVars = (int)local_a8;
        uVar15 = 2;
        if (2 < nVars) {
          uVar15 = local_a8 & 0xffffffff;
        }
        uVar18 = 1;
        do {
          printf(" %d",(ulong)(uint)pNormalArrTime[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
        printf("]@%d:",AigLevel);
        fflush(_stdout);
      }
      puVar19 = local_a0;
      if (1 < nVars) {
        uVar15 = 1;
        do {
          if (pNormalArrTime[0] <= pNormalArrTime[uVar15]) {
            pNormalArrTime[0] = pNormalArrTime[uVar15];
          }
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      iVar5 = pNormalArrTime[0] + nVars + 1;
      if (AigLevel != -1) {
        iVar8 = iVar5 + nVars + 1;
        iVar5 = AigLevel - (int)local_b0;
        if (iVar8 <= AigLevel - (int)local_b0) {
          iVar5 = iVar8;
        }
      }
      iVar8 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar8 < 0) {
        local_c8 = 1;
      }
      else {
        lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_3.tv_nsec),8);
        local_c8 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts_3.tv_sec * -1000000;
      }
      pSes = Ses_ManAlloc(puVar19,nVars,1,iVar5,pNormalArrTime,s_pSesStore->fMakeAIG,
                          s_pSesStore->nBTLimit,s_pSesStore->fVerbose);
      pSVar4 = s_pSesStore;
      pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
      pSes->pSat = pSVar4->pSat;
      pSes->nStartGates = nVars + -2;
      iVar5 = pSes->nMaxDepth;
      pcVar14 = local_b8;
      while (iVar5 != 0) {
        if (s_pSesStore->fVeryVerbose != 0) {
          printf(" %d");
          fflush(_stdout);
        }
        pcVar9 = Ses_ManFindMinimumSize(pSes);
        if (pcVar9 == (char *)0x0) {
          if (s_pSesStore->fVeryVerbose != 0) {
            local_b8 = pcVar14;
            if (9 < pSes->nMaxDepth) {
              putchar(8);
            }
            pcVar14 = "\x1b[31m";
            if (pSes->fHitResLimit == 0) {
              pcVar14 = "\x1b[33m";
            }
            printf("\b%s%d\x1b[0m",pcVar14,(ulong)(uint)pSes->nMaxDepth);
            pcVar14 = local_b8;
          }
          break;
        }
        if (s_pSesStore->fVeryVerbose != 0) {
          if (9 < pSes->nMaxDepth) {
            putchar(8);
          }
          printf("\b\x1b[32m%d\x1b[0m",(ulong)(uint)pSes->nMaxDepth);
        }
        if (pcVar14 != (char *)0x0) {
          free(pcVar14);
        }
        iVar5 = pSes->nMaxDepth + -1;
        pSes->nMaxDepth = iVar5;
        pcVar14 = pcVar9;
      }
      local_b8 = pcVar14;
      if (s_pSesStore->fVeryVerbose != 0) {
        puts("        ");
      }
      pcVar14 = local_b8;
      pSVar4 = s_pSesStore;
      local_b0 = s_pSesStore;
      if (((FILE *)s_pSesStore->pDebugEntries != (FILE *)0x0) && (pSes->fHitResLimit != 0)) {
        uVar7 = pSes->nMaxDepth;
        fprintf((FILE *)s_pSesStore->pDebugEntries,"abc -c \"exact -v -C %d",
                (ulong)(uint)s_pSesStore->nBTLimit);
        if (s_pSesStore->fMakeAIG != 0) {
          fwrite(" -a",3,1,(FILE *)pSVar4->pDebugEntries);
        }
        fprintf((FILE *)pSVar4->pDebugEntries," -S %d -D %d -A",(ulong)uVar6,(ulong)uVar7);
        if ((int)local_a8 != 0) {
          uVar15 = 0;
          do {
            uVar12 = 0x2c;
            if (uVar15 == 0) {
              uVar12 = 0x20;
            }
            fprintf((FILE *)pSVar4->pDebugEntries,"%c%d",uVar12,(ulong)(uint)pNormalArrTime[uVar15])
            ;
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
        fputc(0x20,(FILE *)pSVar4->pDebugEntries);
        iVar5 = (int)local_a8;
        if (iVar5 < 2) {
LAB_002bf428:
          __assert_fail("nVars >= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x4dc,"void Abc_TtPrintHexRev(FILE *, word *, int)");
        }
        iVar8 = 1 << ((char)local_a8 - 6U & 0x1f);
        if (iVar5 < 7) {
          iVar8 = 1;
        }
        puVar19 = local_a0 + (long)iVar8 + -1;
        if (local_a0 <= puVar19) {
          pFVar2 = (FILE *)local_b0->pDebugEntries;
          uVar13 = 0xf;
          if (iVar5 < 6) {
            uVar13 = (ulong)(uint)~(-1 << ((byte)(nVars + -2) & 0x1f));
          }
          lVar11 = uVar13 << 2;
          lVar16 = uVar13 + 1;
          do {
            uVar6 = (uint)(*puVar19 >> ((byte)lVar11 & 0x3c)) & 0xf;
            iVar5 = uVar6 + 0x30;
            if (9 < uVar6) {
              iVar5 = uVar6 + 0x37;
            }
            fputc(iVar5,pFVar2);
            lVar17 = lVar16 + -1;
            bVar3 = 0 < lVar16;
            lVar11 = lVar11 + -4;
            lVar16 = lVar17;
          } while ((lVar17 != 0 && bVar3) ||
                  (puVar19 = puVar19 + -1, lVar11 = uVar13 << 2, lVar16 = uVar13 + 1,
                  local_a0 <= puVar19));
        }
        pSVar4 = local_b0;
        fwrite("\" # ",4,1,(FILE *)local_b0->pDebugEntries);
        if (pcVar14 == (char *)0x0) {
          fwrite("no ",3,1,(FILE *)pSVar4->pDebugEntries);
        }
        fwrite("solution found before\n",0x16,1,(FILE *)pSVar4->pDebugEntries);
        puVar19 = local_a0;
      }
      iVar5 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar5 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
      }
      pSes->timeTotal = lVar11 + local_c8;
      pSVar4 = s_pSesStore;
      s_pSesStore->nSatCalls = s_pSesStore->nSatCalls + (long)pSes->nSatCalls;
      pSVar4->nUnsatCalls = pSVar4->nUnsatCalls + (long)pSes->nUnsatCalls;
      pSVar4->nUndefCalls = pSVar4->nUndefCalls + (long)pSes->nUndefCalls;
      pSVar4->timeSat = pSVar4->timeSat + pSes->timeSat;
      pSVar4->timeSatSat = pSVar4->timeSatSat + pSes->timeSatSat;
      pSVar4->timeSatUnsat = pSVar4->timeSatUnsat + pSes->timeSatUnsat;
      pSVar4->timeSatUndef = pSVar4->timeSatUndef + pSes->timeSatUndef;
      pSVar4->timeInstance = pSVar4->timeInstance + pSes->timeInstance;
      pSVar4->timeExact = pSVar4->timeExact + lVar11 + local_c8;
      iVar5 = pSes->fHitResLimit;
      Ses_ManCleanLight(pSes);
      nVars = (int)local_a8;
      Ses_StoreAddEntry(s_pSesStore,puVar19,nVars,pNormalArrTime,local_b8,iVar5);
    }
    else {
      s_pSesStore->nCacheHits = s_pSesStore->nCacheHits + 1;
      pSVar4->pCacheHits[uVar13] = pSVar4->pCacheHits[uVar13] + 1;
    }
    if (local_b8 != (char *)0x0) {
      *Cost = (int)local_b8[2];
      if (nVars != 0) {
        cVar1 = local_b8[2];
        uVar13 = 1;
        if (1 < nVars) {
          uVar13 = (ulong)(uint)nVars;
        }
        uVar15 = 0;
        do {
          pPerm[uVar15] = local_b8[uVar15 + (long)((int)cVar1 << 2) + 5];
          uVar15 = uVar15 + 1;
        } while (uVar13 != uVar15);
      }
      if (local_b8 != (char *)0x0) {
        if (nVars == 0) {
          iVar5 = 0;
        }
        else {
          uVar13 = 1;
          if (1 < nVars) {
            uVar13 = (ulong)(uint)nVars;
          }
          uVar15 = 0;
          iVar5 = 0;
          do {
            if (iVar5 <= (int)pPerm[uVar15] + pArrTimeProfile[uVar15]) {
              iVar5 = (int)pPerm[uVar15] + pArrTimeProfile[uVar15];
            }
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
        }
        iVar8 = clock_gettime(3,(timespec *)&ts_3);
        if (iVar8 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
        }
        s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
        return iVar5;
      }
    }
    if (*Cost != 1000000000) {
      __assert_fail("*Cost == ABC_INFINITY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                    ,0xb46,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
    }
    iVar5 = clock_gettime(3,(timespec *)&ts_3);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar11 + lVar10;
    iVar5 = 1000000000;
  }
  return iVar5;
}

Assistant:

int Abc_ExactDelayCost( word * pTruth, int nVars, int * pArrTimeProfile, char * pPerm, int * Cost, int AigLevel )
{
    int i, nMaxArrival, nDelta, l;
    Ses_Man_t * pSes = NULL;
    char * pSol = NULL, * pSol2 = NULL, * p;
    int pNormalArrTime[8];
    int Delay = ABC_INFINITY, nMaxDepth, fResLimit;
    abctime timeStart = Abc_Clock(), timeStartExact;

    /* some checks */
    if ( nVars < 0 || nVars > 8 )
    {
        printf( "invalid truth table size %d\n", nVars );
        assert( 0 );
    }

    /* statistics */
    s_pSesStore->nCutCount++;
    s_pSesStore->pCutCount[nVars]++;

    if ( nVars == 0 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[0]++;

        *Cost = 0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return 0;
    }

    if ( nVars == 1 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[1]++;

        *Cost = 0;
        pPerm[0] = (char)0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return pArrTimeProfile[0];
    }

    for ( l = 0; l < nVars; ++l )
        pNormalArrTime[l] = pArrTimeProfile[l];

    nDelta = Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );

    *Cost = ABC_INFINITY;

    if ( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) )
    {
        s_pSesStore->nCacheHits++;
        s_pSesStore->pCacheHits[nVars]++;
    }
    else
    {
        if ( s_pSesStore->fVeryVerbose )
        {
            printf( ANSI_COLOR_CYAN );
            Abc_TtPrintHexRev( stdout, pTruth, nVars );
            printf( ANSI_COLOR_RESET );
            printf( " [%d", pNormalArrTime[0] );
            for ( l = 1; l < nVars; ++l )
                printf( " %d", pNormalArrTime[l] );
            printf( "]@%d:", AigLevel );
            fflush( stdout );
        }

        nMaxDepth = pNormalArrTime[0];
        for ( i = 1; i < nVars; ++i )
            nMaxDepth = Abc_MaxInt( nMaxDepth, pNormalArrTime[i] );
        nMaxDepth += nVars + 1;
        if ( AigLevel != -1 )
            nMaxDepth = Abc_MinInt( AigLevel - nDelta, nMaxDepth + nVars + 1 );

        timeStartExact = Abc_Clock();

        pSes = Ses_ManAlloc( pTruth, nVars, 1 /* nSpecFunc */, nMaxDepth, pNormalArrTime, s_pSesStore->fMakeAIG, s_pSesStore->nBTLimit, s_pSesStore->fVerbose );
        pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
        pSes->pSat = s_pSesStore->pSat;
        pSes->nStartGates = nVars - 2;

        while ( pSes->nMaxDepth ) /* there is improvement */
        {
            if ( s_pSesStore->fVeryVerbose )
            {
                printf( " %d", pSes->nMaxDepth );
                fflush( stdout );
            }

            if ( ( pSol2 = Ses_ManFindMinimumSize( pSes ) ) != NULL )
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b" ANSI_COLOR_GREEN "%d" ANSI_COLOR_RESET, pSes->nMaxDepth );
                }
                if ( pSol )
                    ABC_FREE( pSol );
                pSol = pSol2;
                pSes->nMaxDepth--;
            }
            else
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b%s%d" ANSI_COLOR_RESET, pSes->fHitResLimit ? ANSI_COLOR_RED : ANSI_COLOR_YELLOW, pSes->nMaxDepth );
                }
                break;
            }
        }

        if ( s_pSesStore->fVeryVerbose )
            printf( "        \n" );

        /* log unsuccessful case for debugging */
        if ( s_pSesStore->pDebugEntries && pSes->fHitResLimit )
            Ses_StorePrintDebugEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSes->nMaxDepth, pSol, nVars - 2 );

        pSes->timeTotal = Abc_Clock() - timeStartExact;

        /* statistics */
        s_pSesStore->nSatCalls += pSes->nSatCalls;
        s_pSesStore->nUnsatCalls += pSes->nUnsatCalls;
        s_pSesStore->nUndefCalls += pSes->nUndefCalls;

        s_pSesStore->timeSat += pSes->timeSat;
        s_pSesStore->timeSatSat += pSes->timeSatSat;
        s_pSesStore->timeSatUnsat += pSes->timeSatUnsat;
        s_pSesStore->timeSatUndef += pSes->timeSatUndef;
        s_pSesStore->timeInstance += pSes->timeInstance;
        s_pSesStore->timeExact += pSes->timeTotal;

        /* cleanup (we need to clean before adding since pTruth may have been modified by pSes) */
        fResLimit = pSes->fHitResLimit;
        Ses_ManCleanLight( pSes );

        /* store solution */
        Ses_StoreAddEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSol, fResLimit );
    }

    if ( pSol )
    {
        *Cost = pSol[ABC_EXACT_SOL_NGATES];
        p = pSol + 3 + 4 * pSol[ABC_EXACT_SOL_NGATES] + 1;
        Delay = *p++;
        for ( l = 0; l < nVars; ++l )
            pPerm[l] = *p++;
    }

    if ( pSol )
    {
        int Delay2 = 0;
        for ( l = 0; l < nVars; ++l )
        {
            //printf( "%d ", pPerm[l] );
            Delay2 = Abc_MaxInt( Delay2, pArrTimeProfile[l] + pPerm[l] );
        }
        //printf( "  output arrival = %d    recomputed = %d\n", Delay, Delay2 );
        //if ( Delay != Delay2 )
        //{
        //    printf( "^--- BUG!\n" );
        //    assert( 0 );
        //}

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return Delay2;
    }
    else
    {
        assert( *Cost == ABC_INFINITY );

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return ABC_INFINITY;
    }
}